

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O2

BoxArray * __thiscall amrex::AmrMesh::MakeBaseGrids(BoxArray *__return_storage_ptr__,AmrMesh *this)

{
  pointer pGVar1;
  pointer pIVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  int idim;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  Box result;
  int local_70 [3];
  IntVect fac;
  Box result_1;
  undefined1 *local_3c;
  undefined4 local_34;
  
  fac.vect._0_8_ = &DAT_200000002;
  fac.vect[2] = 2;
  pGVar1 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = *(undefined8 *)(pGVar1->domain).smallend.vect;
  uVar4 = *(undefined8 *)((pGVar1->domain).smallend.vect + 2);
  uVar5 = *(ulong *)((pGVar1->domain).bigend.vect + 2);
  result.bigend.vect[2] = (int)uVar5;
  result.btype.itype = (int)(uVar5 >> 0x20);
  result.smallend.vect[2] = (int)uVar4;
  local_3c = &DAT_200000002;
  local_34 = 2;
  result.btype.itype = (uint)(uVar5 >> 0x20);
  result.bigend.vect[2] = (int)uVar5;
  result.bigend.vect[0] = (int)((long)uVar4 >> 0x21);
  result.bigend.vect[1] = (int)((long)*(undefined8 *)(pGVar1->domain).bigend.vect >> 0x21);
  if (result.btype.itype == 0) {
    result.bigend.vect[2] = result.bigend.vect[2] >> 1;
  }
  else {
    local_70[0] = 0;
    local_70[1] = 0;
    local_70[2] = 0;
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      if (((result.btype.itype >> ((uint)lVar14 & 0x1f) & 1) != 0) &&
         (result.bigend.vect[lVar14] % *(int *)((long)&local_3c + lVar14 * 4) != 0)) {
        local_70[lVar14] = 1;
      }
    }
    result.bigend.vect[0] = (int)local_70._0_8_ + result.bigend.vect[0];
    result.bigend.vect[1] = SUB84(local_70._0_8_,4) + result.bigend.vect[1];
    result.bigend.vect[2] = (result.bigend.vect[2] >> 1) + local_70[2];
  }
  result_1.btype = result.btype;
  result_1.smallend.vect[0] = ((int)uVar3 >> 1) * 2;
  result_1.smallend.vect[1] = (int)((long)uVar3 >> 0x21) * 2;
  result_1.smallend.vect[2] = (result.smallend.vect[2] >> 1) << 1;
  result_1.bigend.vect[0] = result.bigend.vect[0] * 2 + (~result.btype.itype & 1);
  result_1.bigend.vect[1] = result.bigend.vect[1] * 2 + (~(result.btype.itype >> 1) & 1);
  result_1.bigend.vect[2] = result.bigend.vect[2] * 2 + (uint)((uVar5 & 0x400000000) == 0);
  for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
    if ((pGVar1->domain).bigend.vect[lVar14] - (pGVar1->domain).smallend.vect[lVar14] !=
        result_1.bigend.vect[lVar14] - result_1.smallend.vect[lVar14]) {
      fac.vect[lVar14] = 1;
    }
  }
  lVar14 = *(long *)(pGVar1->domain).smallend.vect;
  lVar6 = *(long *)((pGVar1->domain).smallend.vect + 2);
  lVar7 = *(long *)(pGVar1->domain).bigend.vect;
  uVar3 = *(undefined8 *)((pGVar1->domain).bigend.vect + 2);
  result.bigend.vect[1] = (int)((ulong)lVar7 >> 0x20);
  result.bigend.vect[2] = (int)uVar3;
  result.btype.itype = SUB84(uVar3,4);
  result.smallend.vect[2] = (int)lVar6;
  result.bigend.vect[0] = (int)((ulong)lVar6 >> 0x20);
  iVar8 = fac.vect[0];
  iVar9 = fac.vect[1];
  result.smallend.vect[1] = (int)((ulong)lVar14 >> 0x20);
  uVar11 = result.smallend.vect[1];
  if (fac.vect[1] == 1 && fac.vect[0] == 1) {
    result.smallend.vect._0_8_ = lVar14;
    if (fac.vect[2] == 1) {
      iVar15 = 1;
      goto LAB_00562b79;
    }
  }
  else {
    result.smallend.vect[0] = (int)lVar14;
    if (fac.vect[0] != 1) {
      if (fac.vect[0] == 4) {
        if (result.smallend.vect[0] < 0) {
          result.smallend.vect[0] = result.smallend.vect[0] >> 2;
        }
        else {
          result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 2;
        }
      }
      else if (fac.vect[0] == 2) {
        if (result.smallend.vect[0] < 0) {
          result.smallend.vect[0] = result.smallend.vect[0] >> 1;
        }
        else {
          result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 1;
        }
      }
      else if (result.smallend.vect[0] < 0) {
        result.smallend.vect[0] = ~(~result.smallend.vect[0] / fac.vect[0]);
      }
      else {
        result.smallend.vect[0] = result.smallend.vect[0] / fac.vect[0];
      }
    }
    if (fac.vect[1] != 1) {
      if (fac.vect[1] == 4) {
        if (lVar14 < 0) {
          uVar11 = result.smallend.vect[1] >> 2;
        }
        else {
          uVar11 = (uint)result.smallend.vect[1] >> 2;
        }
      }
      else if (fac.vect[1] == 2) {
        if (lVar14 < 0) {
          uVar11 = result.smallend.vect[1] >> 1;
        }
        else {
          uVar11 = (uint)result.smallend.vect[1] >> 1;
        }
      }
      else if (lVar14 < 0) {
        uVar11 = ~(~result.smallend.vect[1] / fac.vect[1]);
      }
      else {
        uVar11 = result.smallend.vect[1] / fac.vect[1];
      }
    }
  }
  result.smallend.vect[1] = uVar11;
  if (fac.vect[2] != 1) {
    if (fac.vect[2] == 4) {
      if (result.smallend.vect[2] < 0) {
        result.smallend.vect[2] = result.smallend.vect[2] >> 2;
      }
      else {
        result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 2;
      }
    }
    else if (fac.vect[2] == 2) {
      if (result.smallend.vect[2] < 0) {
        result.smallend.vect[2] = result.smallend.vect[2] >> 1;
      }
      else {
        result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 1;
      }
    }
    else if (result.smallend.vect[2] < 0) {
      result.smallend.vect[2] = ~(~result.smallend.vect[2] / fac.vect[2]);
    }
    else {
      result.smallend.vect[2] = result.smallend.vect[2] / fac.vect[2];
    }
  }
  result.btype.itype = SUB84(uVar3,4);
  result.bigend.vect[2] = (int)uVar3;
  if (result.btype.itype == 0) {
    uVar11 = result.bigend.vect[0];
    if (fac.vect[0] != 1) {
      if (fac.vect[0] == 4) {
        uVar11 = result.bigend.vect[0] >> 2;
        if (-1 < lVar6) {
          uVar11 = (uint)result.bigend.vect[0] >> 2;
        }
      }
      else if (fac.vect[0] == 2) {
        uVar11 = result.bigend.vect[0] >> 1;
        if (-1 < lVar6) {
          uVar11 = (uint)result.bigend.vect[0] >> 1;
        }
      }
      else if (lVar6 < 0) {
        uVar11 = ~(~result.bigend.vect[0] / fac.vect[0]);
      }
      else {
        uVar11 = result.bigend.vect[0] / fac.vect[0];
      }
    }
    uVar13 = result.bigend.vect[1];
    if (fac.vect[1] != 1) {
      if (fac.vect[1] == 4) {
        uVar13 = result.bigend.vect[1] >> 2;
        if (-1 < lVar7) {
          uVar13 = (uint)result.bigend.vect[1] >> 2;
        }
      }
      else if (fac.vect[1] == 2) {
        uVar13 = result.bigend.vect[1] >> 1;
        if (-1 < lVar7) {
          uVar13 = (uint)result.bigend.vect[1] >> 1;
        }
      }
      else if (lVar7 < 0) {
        uVar13 = ~(~result.bigend.vect[1] / fac.vect[1]);
      }
      else {
        uVar13 = result.bigend.vect[1] / fac.vect[1];
      }
    }
    uVar12 = result.bigend.vect[2];
    result.bigend.vect[0] = uVar11;
    result.bigend.vect[1] = uVar13;
    if (fac.vect[2] != 1) {
      if (fac.vect[2] == 4) {
        uVar12 = result.bigend.vect[2] >> 2;
        if (-1 < result.bigend.vect[2]) {
          uVar12 = (uint)result.bigend.vect[2] >> 2;
        }
      }
      else if (fac.vect[2] == 2) {
        uVar12 = result.bigend.vect[2] >> 1;
        if (-1 < result.bigend.vect[2]) {
          uVar12 = (uint)result.bigend.vect[2] >> 1;
        }
      }
      else if (result.bigend.vect[2] < 0) {
        uVar12 = ~(~result.bigend.vect[2] / fac.vect[2]);
      }
      else {
        uVar12 = result.bigend.vect[2] / fac.vect[2];
      }
    }
  }
  else {
    local_70[0] = 0;
    local_70[1] = 0;
    local_70[2] = 0;
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      if (((result.btype.itype >> ((uint)lVar14 & 0x1f) & 1) != 0) &&
         (result.bigend.vect[lVar14] % fac.vect[lVar14] != 0)) {
        local_70[lVar14] = 1;
      }
    }
    uVar11 = result.bigend.vect[0];
    if (fac.vect[0] != 1) {
      if (fac.vect[0] == 4) {
        uVar11 = result.bigend.vect[0] >> 2;
        if (-1 < lVar6) {
          uVar11 = (uint)result.bigend.vect[0] >> 2;
        }
      }
      else if (fac.vect[0] == 2) {
        uVar11 = result.bigend.vect[0] >> 1;
        if (-1 < lVar6) {
          uVar11 = (uint)result.bigend.vect[0] >> 1;
        }
      }
      else if (lVar6 < 0) {
        uVar11 = ~(~result.bigend.vect[0] / fac.vect[0]);
      }
      else {
        uVar11 = result.bigend.vect[0] / fac.vect[0];
      }
    }
    uVar13 = result.bigend.vect[1];
    if (fac.vect[1] != 1) {
      if (fac.vect[1] == 4) {
        uVar13 = result.bigend.vect[1] >> 2;
        if (-1 < lVar7) {
          uVar13 = (uint)result.bigend.vect[1] >> 2;
        }
      }
      else if (fac.vect[1] == 2) {
        uVar13 = result.bigend.vect[1] >> 1;
        if (-1 < lVar7) {
          uVar13 = (uint)result.bigend.vect[1] >> 1;
        }
      }
      else if (lVar7 < 0) {
        uVar13 = ~(~result.bigend.vect[1] / fac.vect[1]);
      }
      else {
        uVar13 = result.bigend.vect[1] / fac.vect[1];
      }
    }
    uVar12 = result.bigend.vect[2];
    if (fac.vect[2] != 1) {
      if (fac.vect[2] == 4) {
        uVar12 = result.bigend.vect[2] >> 2;
        if (-1 < result.bigend.vect[2]) {
          uVar12 = (uint)result.bigend.vect[2] >> 2;
        }
      }
      else if (fac.vect[2] == 2) {
        uVar12 = result.bigend.vect[2] >> 1;
        if (-1 < result.bigend.vect[2]) {
          uVar12 = (uint)result.bigend.vect[2] >> 1;
        }
      }
      else if (result.bigend.vect[2] < 0) {
        uVar12 = ~(~result.bigend.vect[2] / fac.vect[2]);
      }
      else {
        uVar12 = result.bigend.vect[2] / fac.vect[2];
      }
    }
    uVar12 = uVar12 + local_70[2];
    result.bigend.vect[0] = uVar11 + local_70[0];
    result.bigend.vect[1] = uVar13 + local_70[1];
  }
  result.bigend.vect[2] = uVar12;
  iVar15 = fac.vect[2];
LAB_00562b79:
  BoxArray::BoxArray(__return_storage_ptr__,&result);
  pIVar2 = (this->super_AmrInfo).max_grid_size.
           super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_start;
  result.smallend.vect[2] = pIVar2->vect[2] / iVar15;
  result.smallend.vect._0_8_ =
       (long)pIVar2->vect[1] / (long)iVar9 << 0x20 |
       (long)pIVar2->vect[0] / (long)iVar8 & 0xffffffffU;
  BoxArray::maxSize(__return_storage_ptr__,&result.smallend);
  BoxArray::refine(__return_storage_ptr__,&fac);
  if ((this->super_AmrInfo).refine_grid_layout == true) {
    ChopGrids(this,0,__return_storage_ptr__,*(int *)(ParallelContext::frames + 0x10));
  }
  bVar10 = BoxArray::operator==
                     (__return_storage_ptr__,
                      (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_start);
  if (bVar10) {
    BoxArray::operator=(__return_storage_ptr__,
                        (this->grids).
                        super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  }
  (*this->_vptr_AmrMesh[5])(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

BoxArray
AmrMesh::MakeBaseGrids () const
{
    IntVect fac(2);
    const Box& dom = geom[0].Domain();
    const Box dom2 = amrex::refine(amrex::coarsen(dom,2),2);
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (dom.length(idim) != dom2.length(idim)) {
            fac[idim] = 1;
        }
    }
    BoxArray ba(amrex::coarsen(dom,fac));
    ba.maxSize(max_grid_size[0]/fac);
    ba.refine(fac);
    // Boxes in ba have even number of cells in each direction
    // unless the domain has odd number of cells in that direction.
    if (refine_grid_layout) {
        ChopGrids(0, ba, ParallelDescriptor::NProcs());
    }
    if (ba == grids[0]) {
        ba = grids[0];  // to avoid duplicates
    }
    PostProcessBaseGrids(ba);
    return ba;
}